

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::WindingTest
          (WindingTest *this,TestContext *testCtx,TessPrimitiveType primitiveType,Winding winding,
          bool yFlip)

{
  allocator<char> local_69;
  string local_68;
  string local_48;
  byte local_21;
  Winding local_20;
  TessPrimitiveType TStack_1c;
  bool yFlip_local;
  Winding winding_local;
  TessPrimitiveType primitiveType_local;
  TestContext *testCtx_local;
  WindingTest *this_local;
  
  local_21 = yFlip;
  local_20 = winding;
  TStack_1c = primitiveType;
  _winding_local = testCtx;
  testCtx_local = (TestContext *)this;
  tessellation::(anonymous_namespace)::getCaseName_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)(ulong)primitiveType,winding,yFlip & WINDING_CW,
             yFlip);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__WindingTest_0166db88;
  this->m_primitiveType = TStack_1c;
  this->m_winding = local_20;
  this->m_yFlip = (bool)(local_21 & 1);
  return;
}

Assistant:

WindingTest::WindingTest (tcu::TestContext&			testCtx,
						  const TessPrimitiveType	primitiveType,
						  const Winding				winding,
						  bool						yFlip)
	: TestCase			(testCtx, getCaseName(primitiveType, winding, yFlip), "")
	, m_primitiveType	(primitiveType)
	, m_winding			(winding)
	, m_yFlip			(yFlip)
{
}